

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int commit_send_packet(quicly_conn_t *conn,quicly_send_context_t *s,
                      en_quicly_send_packet_mode_t mode)

{
  size_t *psVar1;
  uint64_t *puVar2;
  quicly_sentmap_t *map;
  ushort uVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  st_quicly_cipher_context_t *psVar6;
  ptls_aead_context_t *ppVar7;
  st_quicly_crypto_engine_t *psVar8;
  _func_void_void_ptr_char_ptr_varargs *p_Var9;
  iovec *piVar10;
  int64_t iVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  st_quicly_application_space_t *psVar16;
  quicly_sent_t *pqVar17;
  st_quicly_sent_block_t *psVar18;
  uint64_t uVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  uint uVar23;
  undefined8 uVar24;
  ulong uVar25;
  uint8_t *puVar26;
  long *in_FS_OFFSET;
  ptls_iovec_t pVar27;
  
  if (((s->target).cipher)->aead == (ptls_aead_context_t *)0x0) {
    __assert_fail("s->target.cipher->aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb0,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  puVar26 = s->dst;
  lVar15 = (long)puVar26 - (long)s->dst_payload_from;
  if (puVar26 == s->dst_payload_from) {
    __assert_fail("s->dst != s->dst_payload_from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb2,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  while (lVar15 < 2) {
    s->dst = puVar26 + 1;
    *puVar26 = '\0';
    puVar26 = s->dst;
    lVar15 = (long)puVar26 - (long)s->dst_payload_from;
  }
  if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
    if (s->num_datagrams == 0) {
      uVar25 = (ulong)(conn->egress).max_udp_payload_size;
    }
    else {
      uVar25 = (ulong)(conn->egress).max_udp_payload_size;
      if (s->datagrams[s->num_datagrams - 1].iov_len != uVar25) {
        __assert_fail("s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xbb9,
                      "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                     );
      }
    }
    uVar25 = uVar25 - 0x10;
    puVar4 = (s->payload_buf).datagram;
    if (uVar25 < (ulong)((long)puVar26 - (long)puVar4)) {
      __assert_fail("s->dst - s->payload_buf.datagram <= max_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xbbb,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    memset(puVar26,0,(size_t)(puVar4 + (uVar25 - (long)puVar26)));
    puVar26 = (s->payload_buf).datagram + uVar25;
    s->dst = puVar26;
  }
  if ((char)*(s->target).first_byte_at < '\0') {
    puVar4 = s->dst_payload_from;
    iVar13 = (int)((s->target).cipher)->aead->algo->tag_size + ((int)puVar26 - (int)puVar4) + 2;
    puVar4[-4] = (byte)((uint)iVar13 >> 8) | 0x40;
    puVar4[-3] = (uint8_t)iVar13;
  }
  else {
    psVar16 = conn->application;
    if ((psVar16->cipher).egress.key_update_pn.next <= (conn->egress).packet_number) {
      iVar13 = update_1rtt_egress_key(conn);
      if (iVar13 != 0) {
        return iVar13;
      }
      psVar16 = conn->application;
    }
    if (((psVar16->cipher).egress.key_phase & 1) != 0) {
      pbVar5 = (s->target).first_byte_at;
      *pbVar5 = *pbVar5 | 4;
    }
  }
  uVar3 = (ushort)(conn->egress).packet_number;
  *(ushort *)(s->dst_payload_from + -2) = uVar3 << 8 | uVar3 >> 8;
  psVar6 = (s->target).cipher;
  puVar26 = (s->payload_buf).datagram;
  ppVar7 = psVar6->aead;
  puVar4 = s->dst;
  sVar21 = ppVar7->algo->tag_size;
  s->dst = puVar4 + sVar21;
  uVar25 = (long)(puVar4 + sVar21) - (long)puVar26;
  if (uVar25 <= (conn->egress).max_udp_payload_size) {
    psVar8 = ((conn->super).ctx)->crypto_engine;
    pVar27.len = uVar25;
    pVar27.base = puVar26;
    (*psVar8->encrypt_packet)
              (psVar8,conn,psVar6->header_protection,ppVar7,pVar27,
               (long)(s->target).first_byte_at - (long)puVar26,
               (long)s->dst_payload_from - (long)puVar26,(conn->egress).packet_number,
               (uint)(mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED));
    if (((s->target).field_0x10 & 1) == 0) {
      uVar20 = 0;
    }
    else {
      uVar20 = (long)s->dst - (long)(s->target).first_byte_at;
      s->send_window = s->send_window - uVar20;
    }
    pqVar17 = (conn->egress).loss.sentmap._pending_packet;
    if (pqVar17 != (quicly_sent_t *)0x0) {
      if ((uint16_t)uVar20 != 0) {
        pbVar5 = (byte *)((long)&pqVar17->data + 0x11);
        *pbVar5 = *pbVar5 | 1;
        (((conn->egress).loss.sentmap._pending_packet)->data).packet.cc_bytes_in_flight =
             (uint16_t)uVar20;
        psVar1 = &(conn->egress).loss.sentmap.bytes_in_flight;
        *psVar1 = *psVar1 + (uVar20 & 0xffff);
        pqVar17 = (conn->egress).loss.sentmap._pending_packet;
      }
      pbVar5 = (byte *)((long)&pqVar17->data + 0x11);
      *pbVar5 = *pbVar5 | 2;
      (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
      psVar1 = &(conn->egress).loss.sentmap.num_packets;
      *psVar1 = *psVar1 + 1;
    }
    (*((conn->egress).cc.type)->cc_on_sent)
              (&(conn->egress).cc,&(conn->egress).loss,(uint32_t)uVar20,(conn->stash).now);
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar13 = ptls_skip_tracing((conn->crypto).tls), iVar13 == 0)) {
      iVar11 = (conn->stash).now;
      uVar19 = (conn->egress).packet_number;
      puVar26 = (s->target).first_byte_at;
      puVar4 = s->dst;
      bVar12 = get_epoch(*puVar26);
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"packet-sent\", \"conn\":%u, \"time\":%lld, \"pn\":%llu, \"len\":%llu, \"packet-type\":%llu, \"ack-only\":%lld}\n"
              ,(ulong)(conn->super).local.cid_set.plaintext.master_id,iVar11,uVar19,
              (long)puVar4 - (long)puVar26,(ulong)bVar12,
              (ulong)(~*(uint *)&(s->target).field_0x10 & 1));
    }
    uVar19 = (conn->egress).packet_number;
    pbVar5 = (s->target).first_byte_at;
    bVar12 = *pbVar5;
    uVar24 = 3;
    if ((char)bVar12 < '\0') {
      bVar12 = bVar12 & 0xf0;
      if (bVar12 == 0xc0) {
        uVar24 = 0;
      }
      else if (bVar12 == 0xd0) {
        uVar24 = 1;
      }
      else {
        if (bVar12 != 0xe0) {
          __assert_fail("!\"FIXME\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x224,"uint8_t get_epoch(uint8_t)");
        }
        uVar24 = 2;
      }
    }
    p_Var9 = (conn->super).tracer.cb;
    if (p_Var9 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var9)((conn->super).tracer.ctx,
                "{\"type\":\"packet-sent\", \"time\":%lld, \"pn\":%llu, \"len\":%llu, \"packet-type\":%llu, \"ack-only\":%lld}\n"
                ,(conn->stash).now,uVar19,(long)s->dst - (long)pbVar5,uVar24,
                (ulong)(~*(uint *)&(s->target).field_0x10 & 1));
      uVar19 = (conn->egress).packet_number;
    }
    puVar2 = &(conn->super).stats.num_packets.sent;
    *puVar2 = *puVar2 + 1;
    uVar20 = uVar19 + 1;
    (conn->egress).packet_number = uVar20;
    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
      puVar2 = &(conn->super).stats.num_bytes.sent;
      *puVar2 = *puVar2 + uVar25;
      piVar10 = s->datagrams;
      sVar21 = s->num_datagrams;
      s->num_datagrams = sVar21 + 1;
      puVar26 = (s->payload_buf).datagram;
      piVar10[sVar21].iov_base = puVar26;
      piVar10[sVar21].iov_len = uVar25;
      (s->payload_buf).datagram = puVar26 + uVar25;
      (s->target).cipher = (st_quicly_cipher_context_t *)0x0;
      (s->target).first_byte_at = (uint8_t *)0x0;
      uVar20 = (conn->egress).packet_number;
    }
    iVar13 = 0;
    if ((((conn->egress).next_pn_to_skip <= uVar20) && (-1 < (char)(s->current).first_byte)) &&
       ((conn->super).state < QUICLY_STATE_CLOSING)) {
      map = &(conn->egress).loss.sentmap;
      iVar13 = quicly_sentmap_prepare(map,uVar20,(conn->stash).now,'\x03');
      if (iVar13 == 0) {
        psVar18 = (conn->egress).loss.sentmap.tail;
        if ((psVar18 == (st_quicly_sent_block_t *)0x0) ||
           (sVar21 = psVar18->next_insert_at, sVar21 == 0x10)) {
          psVar18 = quicly_sentmap__new_block(map);
          if (psVar18 == (st_quicly_sent_block_t *)0x0) {
            return 0x201;
          }
          sVar21 = psVar18->next_insert_at;
        }
        psVar18->next_insert_at = sVar21 + 1;
        psVar18->num_entries = psVar18->num_entries + 1;
        psVar18->entries[sVar21].acked = on_invalid_ack;
        pqVar17 = (conn->egress).loss.sentmap._pending_packet;
        if (pqVar17 == (quicly_sent_t *)0x0) {
          __assert_fail("quicly_sentmap_is_open(map)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                        ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
        }
        pbVar5 = (byte *)((long)&pqVar17->data + 0x11);
        *pbVar5 = *pbVar5 | 2;
        (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
        psVar1 = &(conn->egress).loss.sentmap.num_packets;
        *psVar1 = *psVar1 + 1;
        uVar19 = (conn->egress).packet_number;
        (conn->egress).packet_number = uVar19 + 1;
        uVar14 = (conn->egress).cc.cwnd;
        uVar3 = (conn->egress).max_udp_payload_size;
        lVar15 = *in_FS_OFFSET;
        lVar22 = in_FS_OFFSET[-1];
        if (lVar22 == 0) {
          (*((conn->super).ctx)->tls->random_bytes)((void *)(lVar15 + -0x28),0x20);
          lVar22 = 8;
        }
        iVar13 = 0;
        uVar14 = uVar14 / uVar3;
        uVar23 = 0x20;
        if (0x20 < uVar14) {
          uVar23 = uVar14;
        }
        in_FS_OFFSET[-1] = lVar22 + -1;
        (conn->egress).next_pn_to_skip =
             uVar19 + (ulong)*(uint *)(lVar15 + -0x2c + lVar22 * 4) % (ulong)(uVar23 << 4) + 2;
      }
    }
    return iVar13;
  }
  __assert_fail("datagram_size <= conn->egress.max_udp_payload_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0xbd4,
                "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
               );
}

Assistant:

static int commit_send_packet(quicly_conn_t *conn, quicly_send_context_t *s, enum en_quicly_send_packet_mode_t mode)
{
    size_t datagram_size, packet_bytes_in_flight;

    assert(s->target.cipher->aead != NULL);

    assert(s->dst != s->dst_payload_from);

    /* pad so that the pn + payload would be at least 4 bytes */
    while (s->dst - s->dst_payload_from < QUICLY_MAX_PN_SIZE - QUICLY_SEND_PN_SIZE)
        *s->dst++ = QUICLY_FRAME_TYPE_PADDING;

    if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
        assert(s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size);
        const size_t max_size = conn->egress.max_udp_payload_size - QUICLY_AEAD_TAG_SIZE;
        assert(s->dst - s->payload_buf.datagram <= max_size);
        memset(s->dst, QUICLY_FRAME_TYPE_PADDING, s->payload_buf.datagram + max_size - s->dst);
        s->dst = s->payload_buf.datagram + max_size;
    }

    /* encode packet size, packet number, key-phase */
    if (QUICLY_PACKET_IS_LONG_HEADER(*s->target.first_byte_at)) {
        uint16_t length = s->dst - s->dst_payload_from + s->target.cipher->aead->algo->tag_size + QUICLY_SEND_PN_SIZE;
        /* length is always 2 bytes, see _do_prepare_packet */
        length |= 0x4000;
        quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE - 2, length);
    } else {
        if (conn->egress.packet_number >= conn->application->cipher.egress.key_update_pn.next) {
            int ret;
            if ((ret = update_1rtt_egress_key(conn)) != 0)
                return ret;
        }
        if ((conn->application->cipher.egress.key_phase & 1) != 0)
            *s->target.first_byte_at |= QUICLY_KEY_PHASE_BIT;
    }
    quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE, (uint16_t)conn->egress.packet_number);

    /* encrypt the packet */
    s->dst += s->target.cipher->aead->algo->tag_size;
    datagram_size = s->dst - s->payload_buf.datagram;
    assert(datagram_size <= conn->egress.max_udp_payload_size);

    conn->super.ctx->crypto_engine->encrypt_packet(conn->super.ctx->crypto_engine, conn, s->target.cipher->header_protection,
                                                   s->target.cipher->aead, ptls_iovec_init(s->payload_buf.datagram, datagram_size),
                                                   s->target.first_byte_at - s->payload_buf.datagram,
                                                   s->dst_payload_from - s->payload_buf.datagram, conn->egress.packet_number,
                                                   mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED);

    /* update CC, commit sentmap */
    if (s->target.ack_eliciting) {
        packet_bytes_in_flight = s->dst - s->target.first_byte_at;
        s->send_window -= packet_bytes_in_flight;
    } else {
        packet_bytes_in_flight = 0;
    }
    if (quicly_sentmap_is_open(&conn->egress.loss.sentmap))
        quicly_sentmap_commit(&conn->egress.loss.sentmap, (uint16_t)packet_bytes_in_flight);

    conn->egress.cc.type->cc_on_sent(&conn->egress.cc, &conn->egress.loss, (uint32_t)packet_bytes_in_flight, conn->stash.now);
    QUICLY_PROBE(PACKET_SENT, conn, conn->stash.now, conn->egress.packet_number, s->dst - s->target.first_byte_at,
                 get_epoch(*s->target.first_byte_at), !s->target.ack_eliciting);

    ++conn->egress.packet_number;
    ++conn->super.stats.num_packets.sent;

    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
        conn->super.stats.num_bytes.sent += datagram_size;
        s->datagrams[s->num_datagrams++] = (struct iovec){.iov_base = s->payload_buf.datagram, .iov_len = datagram_size};
        s->payload_buf.datagram += datagram_size;
        s->target.cipher = NULL;
        s->target.first_byte_at = NULL;
    }

    /* insert PN gap if necessary, registering the PN to the ack queue so that we'd close the connection in the event of receiving
     * an ACK for that gap. */
    if (conn->egress.packet_number >= conn->egress.next_pn_to_skip && !QUICLY_PACKET_IS_LONG_HEADER(s->current.first_byte) &&
        conn->super.state < QUICLY_STATE_CLOSING) {
        int ret;
        if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                          QUICLY_EPOCH_1RTT)) != 0)
            return ret;
        if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_invalid_ack) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
        ++conn->egress.packet_number;
        conn->egress.next_pn_to_skip = calc_next_pn_to_skip(conn->super.ctx->tls, conn->egress.packet_number, conn->egress.cc.cwnd,
                                                            conn->egress.max_udp_payload_size);
    }

    return 0;
}